

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O3

void __thiscall tst_RoleMaskProxyModel::testSort(tst_RoleMaskProxyModel *this)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  iterator __first;
  iterator __last;
  QAbstractItemModelTester *this_00;
  long lVar6;
  size_t __i;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  QModelIndex *pQVar10;
  int iVar11;
  long lVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  RoleMaskProxyModel proxyModel;
  QStringList sequence;
  QStringListModel baseModel;
  undefined1 local_14b8 [24];
  undefined8 local_14a0;
  QArrayData *local_1498;
  storage_type_conflict *local_1490;
  long *plStack_1488;
  QModelIndex local_1480;
  anon_union_24_3_e3d07ef4_for_data local_1468;
  undefined8 local_1450;
  QArrayDataPointer<QString> local_1448;
  QArrayData *local_1430;
  storage_type_conflict *local_1428;
  qsizetype local_1420;
  undefined8 local_1418;
  undefined8 local_1410;
  long *plStack_1408;
  undefined8 local_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined1 local_13e8 [16];
  long *local_13d8;
  undefined8 local_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined1 local_13b8 [4992];
  size_t local_38;
  
  local_1448.d = (Data *)0x0;
  local_1448.ptr = (QString *)0x0;
  local_1448.size = 0;
  QList<QString>::reserve((QList<QString> *)&local_1448,100);
  lVar12 = 0;
  do {
    local_14b8._0_8_ = (QArrayData *)0x0;
    local_14b8._8_8_ = L"%1";
    local_14b8._16_8_ = 2;
    iVar11 = (int)local_14b8;
    QString::arg((longlong)local_13b8,iVar11,(int)lVar12,(QChar)0x3);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_1448,local_1448.size,(QString *)local_13b8);
    if ((QArrayData *)local_13b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_13b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_13b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_13b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_13b8._0_8_,2,8);
      }
    }
    if ((QArrayData *)local_14b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_14b8._0_8_ = *(int *)local_14b8._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_14b8._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_14b8._0_8_,2,8);
      }
    }
    lVar12 = lVar12 + 1;
  } while (lVar12 != 100);
  __first = QList<QString>::begin((QList<QString> *)&local_1448);
  __last = QList<QString>::end((QList<QString> *)&local_1448);
  local_13b8._0_8_ = (Data *)0x58;
  lVar12 = 1;
  uVar7 = 0x58;
  do {
    uVar7 = (ulong)(((uint)(uVar7 >> 0x1e) ^ (uint)uVar7) * 0x6c078965 + (int)lVar12);
    *(ulong *)(local_13b8 + lVar12 * 8) = uVar7;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x270);
  local_38 = 0x270;
  std::
  shuffle<QList<QString>::iterator,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (__first,__last,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_13b8);
  QStringListModel::QStringListModel
            ((QStringListModel *)local_13b8,(QList *)&local_1448,(QObject *)0x0);
  RoleMaskProxyModel::RoleMaskProxyModel((RoleMaskProxyModel *)&local_1480,(QObject *)0x0);
  this_00 = (QAbstractItemModelTester *)operator_new(0x10);
  QAbstractItemModelTester::QAbstractItemModelTester
            (this_00,(QAbstractItemModel *)&local_1480,QtTest,&this->super_QObject);
  *(undefined ***)this_00 = &PTR_metaObject_001339b0;
  RoleMaskProxyModel::setSourceModel((QAbstractItemModel *)&local_1480);
  RoleMaskProxyModel::addMaskedRole((int)&local_1480);
  RoleMaskProxyModel::setTransparentIfEmpty(SUB81(&local_1480,0));
  RoleMaskProxyModel::setMaskHeaderData(SUB81(&local_1480,0));
  pQVar10 = (QModelIndex *)0x0;
  do {
    local_1418 = 0xffffffffffffffff;
    local_1410 = 0;
    plStack_1408 = (long *)0x0;
    iVar9 = (int)&local_1480;
    QIdentityProxyModel::index((int)&local_1498,iVar9,pQVar10);
    if (plStack_1488 == (long *)0x0) {
      local_14b8._0_8_ = (QArrayData *)0x0;
      local_14b8._8_8_ = (char16_t *)0x0;
      local_14b8._16_8_ = 0;
      local_14a0 = 2;
    }
    else {
      (**(code **)(*plStack_1488 + 0x90))(local_14b8,plStack_1488,&local_1498,0);
    }
    QVariant::toString();
    QVar13.m_data = (storage_type_conflict *)local_1468._8_8_;
    QVar13.m_size = local_1468._16_8_;
    lVar12 = QString::toIntegral_helper(QVar13,(bool *)0x0,10);
    if ((int)lVar12 != lVar12) {
      lVar12 = 0;
    }
    if ((QArrayData *)local_1468.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_1468.shared = *(int *)local_1468.shared + -1;
      UNLOCK();
      if (*(int *)local_1468.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_1468.shared,2,8);
      }
    }
    QVariant::~QVariant((QVariant *)local_14b8);
    QVariant::QVariant((QVariant *)local_14b8,(int)lVar12);
    bVar1 = (bool)RoleMaskProxyModel::setHeaderData
                            (iVar9,(Orientation)pQVar10,(QVariant *)0x2,iVar11);
    cVar2 = QTest::qVerify(bVar1,
                           "proxyModel.setHeaderData(i, Qt::Vertical, currentData, Qt::UserRole)",""
                           ,
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x501);
    QVariant::~QVariant((QVariant *)local_14b8);
    if (cVar2 == '\0') goto LAB_0011dcf2;
    local_1498 = (QArrayData *)0xffffffffffffffff;
    local_1490 = (storage_type_conflict *)0x0;
    plStack_1488 = (long *)0x0;
    QIdentityProxyModel::index((int)&local_1468,iVar9,pQVar10);
    QVariant::QVariant((QVariant *)local_14b8,(int)lVar12);
    bVar1 = (bool)RoleMaskProxyModel::setData(&local_1480,(QVariant *)&local_1468,iVar11);
    cVar2 = QTest::qVerify(bVar1,
                           "proxyModel.setData(proxyModel.index(i, 0), currentData, Qt::UserRole)",
                           "",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x502);
    QVariant::~QVariant((QVariant *)local_14b8);
    if (cVar2 == '\0') goto LAB_0011dcf2;
    uVar8 = (Orientation)pQVar10 + Horizontal;
    pQVar10 = (QModelIndex *)(ulong)uVar8;
  } while (uVar8 != 100);
  QStringListModel::sort((int)local_13b8,AscendingOrder);
  pQVar10 = (QModelIndex *)0x1;
  do {
    local_13d0 = 0xffffffffffffffff;
    local_13c8 = 0;
    uStack_13c0 = 0;
    iVar9 = (int)pQVar10;
    QIdentityProxyModel::index((int)&local_1418,(int)&local_1480,pQVar10);
    if (plStack_1408 == (long *)0x0) {
      local_14b8._0_8_ = (QArrayData *)0x0;
      local_14b8._8_8_ = (char16_t *)0x0;
      local_14b8._16_8_ = 0;
      local_14a0 = 2;
    }
    else {
      (**(code **)(*plStack_1408 + 0x90))(local_14b8,plStack_1408,&local_1418,0);
    }
    QVariant::toString();
    QVar14.m_data = local_1490;
    QVar14.m_size = (qsizetype)plStack_1488;
    lVar12 = QString::toIntegral_helper(QVar14,(bool *)0x0,10);
    if ((int)lVar12 != lVar12) {
      lVar12 = 0;
    }
    local_1400 = 0xffffffffffffffff;
    local_13f8 = 0;
    uStack_13f0 = 0;
    QIdentityProxyModel::index((int)local_13e8,(int)&local_1480,(QModelIndex *)(ulong)(iVar9 - 1U));
    if (local_13d8 == (long *)0x0) {
      local_1468.shared = (PrivateShared *)0x0;
      local_1468._8_8_ = (storage_type_conflict *)0x0;
      local_1468._16_8_ = (long *)0x0;
      local_1450 = 2;
    }
    else {
      (**(code **)(*local_13d8 + 0x90))(&local_1468,local_13d8,local_13e8,0);
    }
    QVariant::toString();
    QVar15.m_data = local_1428;
    QVar15.m_size = local_1420;
    lVar6 = QString::toIntegral_helper(QVar15,(bool *)0x0,10);
    if ((int)lVar6 == lVar6) {
      iVar5 = (int)lVar6 + 1;
    }
    else {
      iVar5 = 1;
    }
    cVar2 = QTest::qCompare((int)lVar12,iVar5,"proxyModel.index(i, 0).data().toString().toInt()",
                            "proxyModel.index(i - 1, 0).data().toString().toInt() + 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                            ,0x506);
    if (local_1430 != (QArrayData *)0x0) {
      LOCK();
      (local_1430->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1430->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1430->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1430,2,8);
      }
    }
    QVariant::~QVariant((QVariant *)&local_1468);
    if (local_1498 != (QArrayData *)0x0) {
      LOCK();
      (local_1498->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1498->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1498->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1498,2,8);
      }
    }
    QVariant::~QVariant((QVariant *)local_14b8);
    if (cVar2 == '\0') break;
    local_1498 = (QArrayData *)0xffffffffffffffff;
    local_1490 = (storage_type_conflict *)0x0;
    plStack_1488 = (long *)0x0;
    iVar5 = (int)&local_1468;
    QIdentityProxyModel::index(iVar5,(int)&local_1480,(QModelIndex *)(ulong)(iVar9 - 1U));
    if ((long *)local_1468._16_8_ == (long *)0x0) {
      local_14b8._0_8_ = (QArrayData *)0x0;
      local_14b8._8_8_ = (char16_t *)0x0;
      local_14b8._16_8_ = 0;
      local_14a0 = 2;
    }
    else {
      (**(code **)(*(long *)local_1468._16_8_ + 0x90))
                (local_14b8,local_1468._16_8_,&local_1468,0x100);
    }
    iVar4 = QVariant::toInt((bool *)local_14b8);
    QVariant::~QVariant((QVariant *)local_14b8);
    local_1498 = (QArrayData *)0xffffffffffffffff;
    local_1490 = (storage_type_conflict *)0x0;
    plStack_1488 = (long *)0x0;
    QIdentityProxyModel::index(iVar5,(int)&local_1480,pQVar10);
    if ((long *)local_1468._16_8_ == (long *)0x0) {
      local_14b8._0_8_ = (QArrayData *)0x0;
      local_14b8._8_8_ = (char16_t *)0x0;
      local_14b8._16_8_ = 0;
      local_14a0 = 2;
    }
    else {
      (**(code **)(*(long *)local_1468._16_8_ + 0x90))
                (local_14b8,local_1468._16_8_,&local_1468,0x100);
    }
    iVar5 = QVariant::toInt((bool *)local_14b8);
    cVar2 = QTest::qCompare(iVar5,iVar4 + 1,"proxyModel.index(i, 0).data(Qt::UserRole).toInt()",
                            "currentData",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                            ,0x508);
    QVariant::~QVariant((QVariant *)local_14b8);
    if (cVar2 == '\0') break;
    RoleMaskProxyModel::headerData(iVar11,(Orientation)&local_1480,iVar9);
    iVar5 = QVariant::toInt((bool *)local_14b8);
    bVar3 = QTest::qCompare(iVar5,iVar4 + 1,
                            "proxyModel.headerData(i, Qt::Vertical, Qt::UserRole).toInt()",
                            "currentData",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                            ,0x509);
    QVariant::~QVariant((QVariant *)local_14b8);
    pQVar10 = (QModelIndex *)(ulong)(iVar9 + 1U);
  } while ((bVar3 & iVar9 + 1U != 100) != 0);
LAB_0011dcf2:
  RoleMaskProxyModel::~RoleMaskProxyModel((RoleMaskProxyModel *)&local_1480);
  local_13b8._0_8_ = QByteArray::reallocData;
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)(local_13b8 + 0x10));
  QAbstractListModel::~QAbstractListModel((QAbstractListModel *)local_13b8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_1448);
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testSort()
{
    QStringList sequence;
    sequence.reserve(100);
    for (int i = 0; i < 100; ++i)
        sequence.append(QStringLiteral("%1").arg(i, 3, 10, QLatin1Char('0')));
    std::shuffle(sequence.begin(), sequence.end(), std::mt19937(88));
    QStringListModel baseModel(sequence);
    RoleMaskProxyModel proxyModel;
    new ModelTest(&proxyModel, this);
    proxyModel.setSourceModel(&baseModel);
    proxyModel.addMaskedRole(Qt::UserRole);
    proxyModel.setTransparentIfEmpty(true);
    proxyModel.setMaskHeaderData(true);
    for (int i = 0; i < 100; ++i) {
        const int currentData = proxyModel.index(i, 0).data().toString().toInt();
        QVERIFY(proxyModel.setHeaderData(i, Qt::Vertical, currentData, Qt::UserRole));
        QVERIFY(proxyModel.setData(proxyModel.index(i, 0), currentData, Qt::UserRole));
    }
    baseModel.sort(0, Qt::AscendingOrder);
    for (int i = 1; i < 100; ++i) {
        QCOMPARE(proxyModel.index(i, 0).data().toString().toInt(), proxyModel.index(i - 1, 0).data().toString().toInt() + 1);
        const int currentData = proxyModel.index(i - 1, 0).data(Qt::UserRole).toInt() + 1;
        QCOMPARE(proxyModel.index(i, 0).data(Qt::UserRole).toInt(), currentData);
        QCOMPARE(proxyModel.headerData(i, Qt::Vertical, Qt::UserRole).toInt(), currentData);
    }
}